

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *in_RDI;
  Vector3<double> *this_00;
  char *file;
  double extraout_XMM0_Qa;
  FP FVar3;
  AssertHelper *this_01;
  GammaType GVar4;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  GammaType expectedGamma;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int d_1;
  AssertionResult gtest_ar;
  int d;
  ParticleType particle;
  FactorType factor;
  ChargeType charge;
  MassType mass;
  MomentumType momentum;
  PositionType position;
  AssertHelper *in_stack_fffffffffffffdd0;
  double *in_stack_fffffffffffffdd8;
  MomentumType *in_stack_fffffffffffffde0;
  AssertHelper *message;
  PositionType *in_stack_fffffffffffffde8;
  int iVar6;
  double dVar5;
  Particle<(pica::Dimension)1> *in_stack_fffffffffffffdf0;
  Real in_stack_fffffffffffffdf8;
  Type type;
  Particle<(pica::Dimension)1> *in_stack_fffffffffffffe00;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe08;
  Message *in_stack_fffffffffffffe28;
  AssertionResult local_1b0;
  double *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char local_168 [8];
  FactorType local_160;
  AssertionResult local_158 [2];
  ChargeType local_138;
  AssertionResult local_130 [2];
  MassType local_110;
  AssertionResult local_108 [2];
  Vector3<double> local_e8;
  AssertionResult local_d0;
  int local_c0;
  uint local_bc;
  Vector1<double> local_98;
  AssertionResult local_90;
  int local_7c;
  Particle<(pica::Dimension)1> local_78;
  undefined8 local_40;
  double local_38;
  double local_30;
  Vector3<double> local_28;
  Vector1<double> local_10 [2];
  
  local_10[0].x =
       (double)BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::getPosition
                         (in_stack_fffffffffffffe08,(Real)in_stack_fffffffffffffe00,
                          in_stack_fffffffffffffdf8,(Real)in_stack_fffffffffffffdf0);
  pica::Vector3<double>::Vector3(&local_28,-231300000000.0,0.0,1.23e-05);
  local_30 = pica::Constants<double>::electronMass();
  local_38 = pica::Constants<double>::electronCharge();
  local_40 = 0x4061800000000000;
  pica::Particle<(pica::Dimension)1>::Particle
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (FactorType)in_stack_fffffffffffffdd8,
             (TypeIndexType)((ulong)in_stack_fffffffffffffdd0 >> 0x30));
  local_7c = 0;
  while( true ) {
    if (0 < local_7c) {
      local_c0 = 0;
      while( true ) {
        type = (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if (2 < local_c0) {
          local_110 = pica::Particle<(pica::Dimension)1>::getMass(&local_78);
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
                     in_stack_fffffffffffffdd8,(double *)in_stack_fffffffffffffdd0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            testing::AssertionResult::failure_message((AssertionResult *)0x1f64db);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe00,type,
                       (char *)in_stack_fffffffffffffdf0,
                       (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                       (char *)in_stack_fffffffffffffde0);
            testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdd0);
            testing::Message::~Message((Message *)0x1f6538);
          }
          local_bc = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f65bf);
          if (local_bc == 0) {
            local_138 = pica::Particle<(pica::Dimension)1>::getCharge(&local_78);
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
                       in_stack_fffffffffffffdd8,(double *)in_stack_fffffffffffffdd0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe00);
              in_stack_fffffffffffffe00 =
                   (Particle<(pica::Dimension)1> *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x1f6658);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe00,type,
                         (char *)in_stack_fffffffffffffdf0,
                         (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                         (char *)in_stack_fffffffffffffde0);
              testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdd0);
              testing::Message::~Message((Message *)0x1f66b5);
            }
            local_bc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f673c);
            if (local_bc == 0) {
              local_160 = pica::Particle<(pica::Dimension)1>::getFactor(&local_78);
              pcVar2 = "factor";
              testing::internal::EqHelper<false>::Compare<double,double>
                        ((char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffdd8,(double *)in_stack_fffffffffffffdd0);
              iVar6 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe00);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1f67d5);
                type = (Type)((ulong)pcVar2 >> 0x20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffe00,type,
                           (char *)in_stack_fffffffffffffdf0,iVar6,(char *)in_stack_fffffffffffffde0
                          );
                pcVar2 = local_168;
                testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdd0);
                testing::Message::~Message((Message *)0x1f6832);
              }
              local_bc = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f68b9);
              if (local_bc == 0) {
                this_00 = &local_28;
                file = (char *)pica::Vector3<double>::norm2(this_00);
                dVar5 = local_30;
                pica::Constants<double>::c(this_00,pcVar2);
                FVar3 = pica::sqr(dVar5 * extraout_XMM0_Qa);
                iVar6 = (int)((ulong)dVar5 >> 0x20);
                this_01 = (AssertHelper *)sqrt((double)file / FVar3 + 1.0);
                in_RDI[3].data_ = (AssertHelperData *)0x3d719799812dea11;
                if (ABS((double)this_01) < (double)in_RDI[2].data_ ||
                    ABS((double)this_01) == (double)in_RDI[2].data_) {
                  pica::Particle<(pica::Dimension)1>::getGamma(&local_78);
                  testing::internal::CmpHelperLE<double,double>
                            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                             in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
                    testing::AssertionResult::failure_message((AssertionResult *)0x1f6bc1);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffffe00,type,file,iVar6,
                               (char *)in_stack_fffffffffffffde0);
                    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
                    testing::internal::AssertHelper::~AssertHelper(this_01);
                    testing::Message::~Message((Message *)0x1f6c0d);
                  }
                  local_bc = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f6c88);
                }
                else {
                  message = this_01;
                  GVar4 = pica::Particle<(pica::Dimension)1>::getGamma(&local_78);
                  testing::internal::CmpHelperLE<double,double>
                            (in_stack_fffffffffffffe78,
                             (char *)(ABS((double)message - GVar4) / ABS((double)this_01)),
                             in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)&stack0xfffffffffffffe78);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
                    testing::AssertionResult::failure_message((AssertionResult *)0x1f6a20);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffffe00,type,file,iVar6,
                               (char *)message);
                    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdd0);
                    testing::Message::~Message((Message *)0x1f6a7d);
                  }
                  local_bc = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f6afe);
                }
              }
            }
          }
          return;
        }
        pica::Vector3<double>::operator[](&local_28,local_c0);
        pica::Particle<(pica::Dimension)1>::getMomentum(in_stack_fffffffffffffe00);
        pica::Vector3<double>::operator[](&local_e8,local_c0);
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffdd8,(double *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          testing::AssertionResult::failure_message((AssertionResult *)0x1f6349);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe00,
                     (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                     (char *)in_stack_fffffffffffffdf0,
                     (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     (char *)in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x1f63a6);
        }
        local_bc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f642a);
        if (local_bc != 0) break;
        local_c0 = local_c0 + 1;
      }
      return;
    }
    in_stack_fffffffffffffe28 = (Message *)pica::Vector1<double>::operator[](local_10,local_7c);
    local_98.x = (double)pica::Particle<(pica::Dimension)1>::getPosition(&local_78);
    pica::Vector1<double>::operator[](&local_98,local_7c);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8,(double *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::AssertionResult::failure_message((AssertionResult *)0x1f617a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe00,
                 (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),(char *)in_stack_fffffffffffffdf0,
                 (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(char *)in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffe28);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x1f61d7);
    }
    local_bc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f625b);
    if (local_bc != 0) break;
    local_7c = local_7c + 1;
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Constructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(3.1, -32.1, 4.3e-5);
    MomentumType momentum(-231.3e9, 0.0, 1.23e-5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    FactorType factor = static_cast<FactorType>(1.4e2);

    ParticleType particle(position, momentum, factor, 0);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(factor, particle.getFactor());
    GammaType expectedGamma = sqrt((FP)1 + momentum.norm2() / sqr(mass * Constants<GammaType >::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}